

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int av1_search_palette_mode
              (IntraModeSearchState *intra_search_state,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
              ,uint ref_frame_cost,PICK_MODE_CONTEXT *ctx,RD_STATS *this_rd_cost,int64_t best_rd)

{
  long lVar1;
  int iVar2;
  int iVar3;
  void *__dest;
  BLOCK_SIZE in_CL;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int *in_stack_00000008;
  undefined8 in_stack_00000010;
  TX_SIZE uv_tx;
  RD_STATS rd_stats_y;
  int cols;
  int rows;
  int *intra_mode_cost;
  ModeCosts *mode_costs;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  MB_MODE_INFO best_mbmi_palette;
  uint8_t *color_map;
  uint8_t *best_palette_color_map;
  int skippable;
  int64_t this_rd;
  int64_t best_rd_palette;
  int64_t distortion2;
  int rate2;
  MACROBLOCKD *xd;
  int num_planes;
  PALETTE_MODE_INFO *pmi;
  MB_MODE_INFO *mbmi;
  AV1_COMMON *cm;
  uint8_t *in_stack_00003ea0;
  MB_MODE_INFO *in_stack_00003ea8;
  int in_stack_00003eb0;
  BLOCK_SIZE in_stack_00003eb7;
  MACROBLOCK *in_stack_00003eb8;
  AV1_COMP *in_stack_00003ec0;
  int64_t *in_stack_00003f00;
  int *in_stack_00003f08;
  int *in_stack_00003f10;
  int64_t *in_stack_00003f18;
  uint8_t *in_stack_00003f20;
  int *in_stack_00003f28;
  PICK_MODE_CONTEXT *in_stack_00003f30;
  uint8_t *in_stack_00003f38;
  uint8_t *in_stack_00003f40;
  MACROBLOCKD *xd_00;
  bool local_9d1;
  RD_STATS local_9b8;
  uint local_990;
  uint local_98c;
  long local_988;
  long local_980;
  undefined1 local_978 [304];
  uint8_t *in_stack_fffffffffffff7b8;
  int64_t *in_stack_fffffffffffff7c0;
  int *in_stack_fffffffffffff7c8;
  int *in_stack_fffffffffffff7d0;
  MACROBLOCK *in_stack_fffffffffffff7d8;
  AV1_COMP *in_stack_fffffffffffff7e0;
  BLOCK_SIZE in_stack_fffffffffffff800;
  TX_SIZE in_stack_fffffffffffff808;
  undefined1 local_578 [1032];
  undefined1 local_170 [176];
  void *local_c0;
  void *local_b8;
  uint local_ac;
  undefined8 local_a0;
  long local_98;
  int local_8c;
  MACROBLOCKD *local_88;
  int local_7c;
  void *local_78;
  void *local_70;
  AV1_COMMON *local_68;
  long local_60;
  int local_58;
  BLOCK_SIZE local_51;
  long local_50;
  long local_40;
  uint local_34;
  
  local_68 = (AV1_COMMON *)(in_RSI + 0x3bf80);
  local_70 = (void *)**(long **)(in_RDX + 0x2058);
  local_78 = (void *)((long)local_70 + 0x5e);
  local_60 = in_R9;
  local_58 = in_R8D;
  local_51 = in_CL;
  local_50 = in_RDX;
  local_40 = in_RDI;
  local_7c = av1_num_planes(local_68);
  local_88 = (MACROBLOCKD *)(local_50 + 0x1a0);
  local_8c = 0;
  local_98 = 0;
  local_a0 = in_stack_00000010;
  local_ac = 0;
  local_b8 = *(void **)(local_50 + 0x41c0);
  local_c0 = *(void **)(local_50 + 0x250);
  memcpy(local_170,local_70,0xb0);
  local_980 = local_50 + 0x4230;
  local_988 = local_50 + 0x4550 + (ulong)""[local_51] * 0x34;
  local_98c = (uint)block_size_high[local_51];
  local_990 = (uint)block_size_wide[local_51];
  *(undefined1 *)((long)local_70 + 2) = 0;
  *(undefined1 *)((long)local_70 + 3) = 0;
  *(undefined1 *)((long)local_70 + 0x10) = 0;
  *(undefined1 *)((long)local_70 + 0x11) = 0xff;
  memset((void *)((long)local_78 + 0x30),0,2);
  av1_invalid_rd_stats(&local_9b8);
  iVar3 = (int)&local_9b8 + 8;
  xd_00 = (MACROBLOCKD *)0x0;
  av1_rd_pick_palette_intra_sby
            (in_stack_00003ec0,in_stack_00003eb8,in_stack_00003eb7,in_stack_00003eb0,
             in_stack_00003ea8,in_stack_00003ea0,in_stack_00003f00,in_stack_00003f08,
             in_stack_00003f10,in_stack_00003f18,in_stack_00003f20,in_stack_00003f28,
             in_stack_00003f30,in_stack_00003f38,in_stack_00003f40);
  if ((local_9b8.rate == 0x7fffffff) || (*(char *)((long)local_78 + 0x30) == '\0')) {
    in_stack_00000008[4] = -1;
    in_stack_00000008[5] = 0x7fffffff;
    local_34 = local_ac;
  }
  else {
    __dest = (void *)(local_50 + 0x24e09);
    iVar2 = bsize_to_num_blk(local_51);
    memcpy(__dest,local_578,(long)iVar2);
    memcpy(local_88->tx_type_map,local_978,(long)*(int *)(local_60 + 0x1a0));
    memcpy(local_c0,local_b8,(long)(int)(local_98c * local_990));
    local_ac = (uint)local_9b8.skip_txfm;
    local_98 = local_9b8.dist;
    local_8c = local_9b8.rate + local_58;
    if (1 < local_7c) {
      if (*(int *)(local_40 + 0x1c) == 0x7fffffff) {
        av1_get_tx_size(iVar3,xd_00);
        av1_rd_pick_intra_sbuv_mode
                  (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
                   in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                   in_stack_fffffffffffff800,in_stack_fffffffffffff808);
        *(undefined1 *)(local_40 + 0x31) = *(undefined1 *)((long)local_70 + 3);
        memcpy((void *)(local_40 + 0x32),local_78,0x32);
        *(undefined1 *)(local_40 + 100) = *(undefined1 *)((long)local_70 + 0x59);
      }
      *(undefined1 *)((long)local_70 + 3) = *(undefined1 *)(local_40 + 0x31);
      *(undefined1 *)((long)local_78 + 0x31) = *(undefined1 *)(local_40 + 99);
      if (*(char *)((long)local_78 + 0x31) != '\0') {
        *(undefined8 *)((long)local_78 + 0x10) = *(undefined8 *)(local_40 + 0x42);
        *(undefined8 *)((long)local_78 + 0x18) = *(undefined8 *)(local_40 + 0x4a);
        *(undefined8 *)((long)local_78 + 0x20) = *(undefined8 *)(local_40 + 0x52);
        *(undefined8 *)((long)local_78 + 0x28) = *(undefined8 *)(local_40 + 0x5a);
      }
      *(undefined1 *)((long)local_70 + 0x59) = *(undefined1 *)(local_40 + 100);
      local_9d1 = false;
      if (local_ac != 0) {
        local_9d1 = *(char *)(local_40 + 0x30) != '\0';
      }
      local_ac = (uint)local_9d1;
      local_98 = *(long *)(local_40 + 0x28) + local_98;
      local_8c = *(int *)(local_40 + 0x1c) + local_8c;
    }
    lVar1 = local_980;
    if (local_ac == 0) {
      iVar3 = av1_get_skip_txfm_context(local_88);
      local_8c = *(int *)(lVar1 + 0x4a50 + (long)iVar3 * 8) + local_8c;
    }
    else {
      local_8c = local_8c - local_9b8.rate;
      if (1 < local_7c) {
        local_8c = local_8c - *(int *)(local_40 + 0x20);
      }
      iVar3 = av1_get_skip_txfm_context(local_88);
      local_8c = *(int *)(lVar1 + 0x4a54 + (long)iVar3 * 8) + local_8c;
    }
    iVar3 = *(int *)(local_50 + 0x4218);
    *in_stack_00000008 = local_8c;
    *(long *)(in_stack_00000008 + 2) = local_98;
    *(long *)(in_stack_00000008 + 4) = ((long)local_8c * (long)iVar3 + 0x100 >> 9) + local_98 * 0x80
    ;
    local_34 = local_ac;
  }
  return local_34;
}

Assistant:

int av1_search_palette_mode(IntraModeSearchState *intra_search_state,
                            const AV1_COMP *cpi, MACROBLOCK *x,
                            BLOCK_SIZE bsize, unsigned int ref_frame_cost,
                            PICK_MODE_CONTEXT *ctx, RD_STATS *this_rd_cost,
                            int64_t best_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  MB_MODE_INFO *const mbmi = x->e_mbd.mi[0];
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  int rate2 = 0;
  int64_t distortion2 = 0, best_rd_palette = best_rd, this_rd;
  int skippable = 0;
  uint8_t *const best_palette_color_map =
      x->palette_buffer->best_palette_color_map;
  uint8_t *const color_map = xd->plane[0].color_index_map;
  MB_MODE_INFO best_mbmi_palette = *mbmi;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *const intra_mode_cost =
      mode_costs->mbmode_cost[size_group_lookup[bsize]];
  const int rows = block_size_high[bsize];
  const int cols = block_size_wide[bsize];

  mbmi->mode = DC_PRED;
  mbmi->uv_mode = UV_DC_PRED;
  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  av1_zero(pmi->palette_size);

  RD_STATS rd_stats_y;
  av1_invalid_rd_stats(&rd_stats_y);
  av1_rd_pick_palette_intra_sby(cpi, x, bsize, intra_mode_cost[DC_PRED],
                                &best_mbmi_palette, best_palette_color_map,
                                &best_rd_palette, &rd_stats_y.rate, NULL,
                                &rd_stats_y.dist, &rd_stats_y.skip_txfm, NULL,
                                ctx, best_blk_skip, best_tx_type_map);
  if (rd_stats_y.rate == INT_MAX || pmi->palette_size[0] == 0) {
    this_rd_cost->rdcost = INT64_MAX;
    return skippable;
  }

  memcpy(x->txfm_search_info.blk_skip, best_blk_skip,
         sizeof(best_blk_skip[0]) * bsize_to_num_blk(bsize));
  av1_copy_array(xd->tx_type_map, best_tx_type_map, ctx->num_4x4_blk);
  memcpy(color_map, best_palette_color_map,
         rows * cols * sizeof(best_palette_color_map[0]));

  skippable = rd_stats_y.skip_txfm;
  distortion2 = rd_stats_y.dist;
  rate2 = rd_stats_y.rate + ref_frame_cost;
  if (num_planes > 1) {
    if (intra_search_state->rate_uv_intra == INT_MAX) {
      // We have not found any good uv mode yet, so we need to search for it.
      TX_SIZE uv_tx = av1_get_tx_size(AOM_PLANE_U, xd);
      av1_rd_pick_intra_sbuv_mode(cpi, x, &intra_search_state->rate_uv_intra,
                                  &intra_search_state->rate_uv_tokenonly,
                                  &intra_search_state->dist_uvs,
                                  &intra_search_state->skip_uvs, bsize, uv_tx);
      intra_search_state->mode_uv = mbmi->uv_mode;
      intra_search_state->pmi_uv = *pmi;
      intra_search_state->uv_angle_delta = mbmi->angle_delta[PLANE_TYPE_UV];
    }

    // We have found at least one good uv mode before, so copy and paste it
    // over.
    mbmi->uv_mode = intra_search_state->mode_uv;
    pmi->palette_size[1] = intra_search_state->pmi_uv.palette_size[1];
    if (pmi->palette_size[1] > 0) {
      memcpy(pmi->palette_colors + PALETTE_MAX_SIZE,
             intra_search_state->pmi_uv.palette_colors + PALETTE_MAX_SIZE,
             2 * PALETTE_MAX_SIZE * sizeof(pmi->palette_colors[0]));
    }
    mbmi->angle_delta[PLANE_TYPE_UV] = intra_search_state->uv_angle_delta;
    skippable = skippable && intra_search_state->skip_uvs;
    distortion2 += intra_search_state->dist_uvs;
    rate2 += intra_search_state->rate_uv_intra;
  }

  if (skippable) {
    rate2 -= rd_stats_y.rate;
    if (num_planes > 1) rate2 -= intra_search_state->rate_uv_tokenonly;
    rate2 += mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][1];
  } else {
    rate2 += mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][0];
  }
  this_rd = RDCOST(x->rdmult, rate2, distortion2);
  this_rd_cost->rate = rate2;
  this_rd_cost->dist = distortion2;
  this_rd_cost->rdcost = this_rd;
  return skippable;
}